

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

TRef recff_io_fp(jit_State *J,TRef *udp,int32_t id)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  
  if (id == 0) {
    uVar1 = *J->base;
    if ((uVar1 & 0x1f000000) != 0xc000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4510000c;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
  }
  else {
    uVar1 = lj_ir_ggfload(J,IRT_UDATA,(long)(id * 8 + 0x208));
  }
  *udp = uVar1;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000d;
  TVar2 = lj_opt_fold(J);
  TVar3 = lj_ir_knull(J,IRT_P64);
  (J->fold).ins.field_0.ot = 0x989;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  return TVar2;
}

Assistant:

static TRef recff_io_fp(jit_State *J, TRef *udp, int32_t id)
{
  TRef tr, ud, fp;
  if (id) {  /* io.func() */
    ud = lj_ir_ggfload(J, IRT_UDATA, GG_OFS(g.gcroot[id]));
  } else {  /* fp:method() */
    ud = J->base[0];
    if (!tref_isudata(ud))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
  }
  *udp = ud;
  fp = emitir(IRT(IR_FLOAD, IRT_PTR), ud, IRFL_UDATA_FILE);
  emitir(IRTG(IR_NE, IRT_PTR), fp, lj_ir_knull(J, IRT_PTR));
  return fp;
}